

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1,false>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer ppVar14;
  double dVar15;
  double dVar16;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __first;
  bool bVar17;
  FractionalInteger *pFVar18;
  FractionalInteger *pFVar19;
  ulong uVar20;
  ulong uVar21;
  FractionalInteger *pFVar22;
  long lVar23;
  pointer *pppVar24;
  ulong uVar25;
  long lVar26;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var27;
  ulong uVar28;
  pointer ppVar29;
  undefined7 in_register_00000081;
  FractionalInteger *pFVar30;
  double dVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:124:11)>
  __cmp;
  _DistanceType __len;
  int local_15c;
  FractionalInteger local_138;
  FractionalInteger *local_f8;
  pointer ppStack_f0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_e0;
  undefined8 local_d8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_d0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_c8;
  pointer ppStack_c0;
  double local_b8;
  ulong local_b0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_a0;
  double local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_78;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_70;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_68;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_60;
  FractionalInteger *local_58;
  pointer local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar28 = (long)end._M_current - (long)begin._M_current;
  if ((long)uVar28 < 0x540) {
    if (!leftmost) {
LAB_002eb363:
      if (begin._M_current == end._M_current) {
        return;
      }
      while (pFVar18 = begin._M_current, begin._M_current = pFVar18 + 1,
            begin._M_current != end._M_current) {
        dVar31 = pFVar18[1].fractionality;
        iVar5 = pFVar18[1].basisIndex;
        if ((pFVar18->fractionality < dVar31) ||
           ((pFVar18->fractionality <= dVar31 &&
            (uVar25 = (long)pFVar18->basisIndex + (comp.this)->numTries,
            uVar28 = uVar25 & 0xffffffff, uVar25 = uVar25 >> 0x20,
            uVar20 = (comp.this)->numTries + (long)iVar5, uVar21 = uVar20 & 0xffffffff,
            uVar20 = uVar20 >> 0x20,
            ((uVar28 + 0x42d8680e260ae5b) * (uVar25 + 0x8a183895eeac1536) ^
            (uVar25 + 0x80c8963be3e4c2f3) * (uVar28 + 0xc8497d2a400d9551) >> 0x20) <
            ((uVar21 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
            (uVar20 + 0x80c8963be3e4c2f3) * (uVar21 + 0xc8497d2a400d9551) >> 0x20))))) {
          local_d8._4_4_ = (undefined4)((ulong)local_d8 >> 0x20);
          local_d8 = (FractionalInteger *)CONCAT44(local_d8._4_4_,iVar5);
          local_138.fractionality = pFVar18[1].row_ep_norm2;
          local_138.row_ep_norm2._0_4_ = SUB84(pFVar18[1].score,0);
          local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar18[1].score >> 0x20);
          local_f8 = (FractionalInteger *)
                     pFVar18[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppStack_f0 = pFVar18[1].row_ep.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_e0._M_current =
               (FractionalInteger *)
               pFVar18[1].row_ep.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          pFVar18[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          pFVar18[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pFVar18[1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          do {
            pFVar19 = pFVar18;
            dVar4 = pFVar19->fractionality;
            dVar15 = pFVar19->row_ep_norm2;
            uVar7 = *(undefined8 *)((long)&pFVar19->score + 4);
            ppVar12 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            *(undefined8 *)((long)&pFVar19[1].row_ep_norm2 + 4) =
                 *(undefined8 *)((long)&pFVar19->row_ep_norm2 + 4);
            *(undefined8 *)((long)&pFVar19[1].score + 4) = uVar7;
            pFVar19[1].fractionality = dVar4;
            pFVar19[1].row_ep_norm2 = dVar15;
            ppVar29 = pFVar19[1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pFVar19[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            pFVar19[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            pFVar19[1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pFVar19->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (ppVar29 != (pointer)0x0) {
              operator_delete(ppVar29);
            }
            pFVar18 = pFVar19 + -1;
          } while ((pFVar19[-1].fractionality < dVar31) ||
                  ((pFVar19[-1].fractionality <= dVar31 &&
                   (uVar25 = (long)pFVar19[-1].basisIndex + (comp.this)->numTries,
                   uVar28 = uVar25 & 0xffffffff, uVar25 = uVar25 >> 0x20,
                   uVar20 = (comp.this)->numTries + (long)iVar5, uVar21 = uVar20 & 0xffffffff,
                   uVar20 = uVar20 >> 0x20,
                   ((uVar28 + 0x42d8680e260ae5b) * (uVar25 + 0x8a183895eeac1536) ^
                   (uVar25 + 0x80c8963be3e4c2f3) * (uVar28 + 0xc8497d2a400d9551) >> 0x20) <
                   ((uVar21 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                   (uVar20 + 0x80c8963be3e4c2f3) * (uVar21 + 0xc8497d2a400d9551) >> 0x20)))));
          pFVar19->fractionality = dVar31;
          pFVar19->row_ep_norm2 = local_138.fractionality;
          pFVar19->score =
               (double)CONCAT44(local_138.row_ep_norm2._4_4_,local_138.row_ep_norm2._0_4_);
          pFVar19->basisIndex = (HighsInt)local_d8;
          ppVar29 = (pFVar19->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (pFVar19->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_f8;
          (pFVar19->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = ppStack_f0;
          (pFVar19->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e0._M_current;
          if (ppVar29 != (pointer)0x0) {
            operator_delete(ppVar29);
          }
        }
      }
      return;
    }
  }
  else {
    local_d8 = (FractionalInteger *)
               CONCAT44(local_d8._4_4_,(int)CONCAT71(in_register_00000081,leftmost));
    local_e0._M_current = end._M_current + -1;
    local_a0._M_current = end._M_current + -2;
    local_a8._M_current = end._M_current + -3;
    local_68 = &end._M_current[-1].row_ep;
    local_70 = &end._M_current[-2].row_ep;
    local_78 = &end._M_current[-3].row_ep;
    local_15c = bad_allowed;
    local_d0._M_current = begin._M_current;
    do {
      __first._M_current = local_d0._M_current;
      local_f8 = (FractionalInteger *)((uVar28 >> 3) / 7);
      uVar20 = (uVar28 >> 3) / 0xe;
      _Var27._M_current = local_d0._M_current + uVar20;
      if (uVar28 < 0x1c01) {
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (_Var27,local_d0,local_e0,comp);
      }
      else {
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (local_d0,_Var27,local_e0,comp);
        local_c8._M_current = __first._M_current + (uVar20 - 1);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (__first._M_current + 1,local_c8,local_a0,comp);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (__first._M_current + 2,__first._M_current + uVar20 + 1,local_a8,comp);
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                  (local_c8,_Var27,__first._M_current + uVar20 + 1,comp);
        local_138.fractionality = (__first._M_current)->fractionality;
        dVar31 = (__first._M_current)->row_ep_norm2;
        local_138._20_8_ = *(undefined8 *)((long)&(__first._M_current)->score + 4);
        local_138.score._0_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4) >> 0x20);
        local_138.row_ep_norm2._0_4_ = SUB84(dVar31,0);
        local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar31 >> 0x20);
        ppVar29 = ((__first._M_current)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar12 = ((__first._M_current)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar13 = ((__first._M_current)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        dVar4 = (_Var27._M_current)->row_ep_norm2;
        uVar7 = *(undefined8 *)((long)&(_Var27._M_current)->row_ep_norm2 + 4);
        uVar8 = *(undefined8 *)((long)&(_Var27._M_current)->score + 4);
        (__first._M_current)->fractionality = (_Var27._M_current)->fractionality;
        (__first._M_current)->row_ep_norm2 = dVar4;
        *(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4) = uVar7;
        *(undefined8 *)((long)&(__first._M_current)->score + 4) = uVar8;
        ppVar14 = ((_Var27._M_current)->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             ((_Var27._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar14;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             ((_Var27._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        *(ulong *)((long)&(_Var27._M_current)->row_ep_norm2 + 4) =
             CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
        *(undefined8 *)((long)&(_Var27._M_current)->score + 4) = local_138._20_8_;
        (_Var27._M_current)->fractionality = local_138.fractionality;
        (_Var27._M_current)->row_ep_norm2 = dVar31;
        ((_Var27._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar12;
        ((_Var27._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar13;
        ((_Var27._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar29;
      }
      dVar31 = (__first._M_current)->fractionality;
      if (((((ulong)local_d8 & 1) != 0) || (dVar31 < __first._M_current[-1].fractionality)) ||
         ((dVar31 <= __first._M_current[-1].fractionality &&
          (uVar25 = (long)(__first._M_current)->basisIndex + (comp.this)->numTries,
          uVar28 = uVar25 & 0xffffffff, uVar25 = uVar25 >> 0x20,
          uVar21 = (long)__first._M_current[-1].basisIndex + (comp.this)->numTries,
          uVar20 = uVar21 & 0xffffffff, uVar21 = uVar21 >> 0x20,
          ((uVar28 + 0x42d8680e260ae5b) * (uVar25 + 0x8a183895eeac1536) ^
          (uVar25 + 0x80c8963be3e4c2f3) * (uVar28 + 0xc8497d2a400d9551) >> 0x20) <
          ((uVar20 + 0x42d8680e260ae5b) * (uVar21 + 0x8a183895eeac1536) ^
          (uVar21 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20))))) {
        local_98 = (__first._M_current)->row_ep_norm2;
        uStack_90 = SUB84((__first._M_current)->score,0);
        uStack_8c = (undefined4)((ulong)(__first._M_current)->score >> 0x20);
        iVar5 = (__first._M_current)->basisIndex;
        local_c8._M_current = (FractionalInteger *)&(__first._M_current)->row_ep;
        uVar32 = *(undefined4 *)
                  &((__first._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar33 = *(undefined4 *)
                  ((long)&((__first._M_current)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
        uVar34 = *(undefined4 *)
                  &((__first._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar35 = *(undefined4 *)
                  ((long)&((__first._M_current)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4);
        local_50 = ((__first._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar23 = (comp.this)->numTries;
        local_b0 = CONCAT44(local_b0._4_4_,iVar5);
        uVar28 = lVar23 + iVar5;
        uVar20 = uVar28 & 0xffffffff;
        uVar28 = uVar28 >> 0x20;
        uVar28 = (uVar28 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20 ^
                 (uVar28 + 0x8a183895eeac1536) * (uVar20 + 0x42d8680e260ae5b);
        lVar26 = 0x38;
        while ((dVar4 = *(double *)((long)&(__first._M_current)->fractionality + lVar26),
               dVar31 < dVar4 ||
               ((dVar31 <= dVar4 &&
                (uVar20 = *(int *)((long)&(__first._M_current)->basisIndex + lVar26) + lVar23,
                uVar25 = uVar20 & 0xffffffff, uVar20 = uVar20 >> 0x20,
                uVar28 < ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                         (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20))))))
        {
          lVar26 = lVar26 + 0x38;
        }
        local_58 = (FractionalInteger *)((long)&(__first._M_current)->fractionality + lVar26);
        _Var27._M_current = local_e0._M_current;
        if (lVar26 == 0x38) {
          do {
            pFVar19 = _Var27._M_current;
            pFVar18 = pFVar19 + 1;
            if ((pFVar19 + 1 <= local_58) || (pFVar18 = pFVar19, dVar31 < pFVar19->fractionality))
            break;
            _Var27._M_current = pFVar19 + -1;
          } while ((pFVar19->fractionality < dVar31) ||
                  (uVar20 = pFVar19->basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                  uVar20 = uVar20 >> 0x20,
                  ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                  (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20) <= uVar28))
          ;
        }
        else {
          do {
            pFVar18 = _Var27._M_current;
            if (dVar31 < pFVar18->fractionality) break;
            _Var27._M_current = pFVar18 + -1;
          } while ((pFVar18->fractionality < dVar31) ||
                  (uVar20 = pFVar18->basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                  uVar20 = uVar20 >> 0x20,
                  ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                  (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20) <= uVar28))
          ;
        }
        pFVar19 = pFVar18;
        begin._M_current = local_58;
        if (local_58 < pFVar18) {
          do {
            local_138.fractionality = (begin._M_current)->fractionality;
            dVar4 = (begin._M_current)->row_ep_norm2;
            local_138._20_8_ = *(undefined8 *)((long)&(begin._M_current)->score + 4);
            local_138.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_138.row_ep_norm2._0_4_ = SUB84(dVar4,0);
            local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
            ppVar29 = ((begin._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar12 = ((begin._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = ((begin._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar15 = pFVar19->row_ep_norm2;
            uVar7 = *(undefined8 *)((long)&pFVar19->row_ep_norm2 + 4);
            uVar8 = *(undefined8 *)((long)&pFVar19->score + 4);
            (begin._M_current)->fractionality = pFVar19->fractionality;
            (begin._M_current)->row_ep_norm2 = dVar15;
            *(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) = uVar7;
            *(undefined8 *)((long)&(begin._M_current)->score + 4) = uVar8;
            ppVar14 = (pFVar19->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pFVar19->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pFVar19->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(ulong *)((long)&pFVar19->row_ep_norm2 + 4) =
                 CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
            *(undefined8 *)((long)&pFVar19->score + 4) = local_138._20_8_;
            pFVar19->fractionality = local_138.fractionality;
            pFVar19->row_ep_norm2 = dVar4;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            (pFVar19->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            lVar23 = (comp.this)->numTries;
            uVar28 = lVar23 + iVar5;
            uVar20 = uVar28 & 0xffffffff;
            uVar28 = uVar28 >> 0x20;
            uVar28 = (uVar28 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20 ^
                     (uVar28 + 0x8a183895eeac1536) * (uVar20 + 0x42d8680e260ae5b);
            do {
              do {
                pFVar22 = begin._M_current;
                begin._M_current = pFVar22 + 1;
              } while (dVar31 < (begin._M_current)->fractionality);
            } while ((dVar31 <= (begin._M_current)->fractionality) &&
                    (uVar20 = pFVar22[1].basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                    uVar20 = uVar20 >> 0x20,
                    uVar28 < ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                             (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20))
                    );
            pFVar22 = pFVar19 + -1;
            do {
              pFVar19 = pFVar22;
              if (dVar31 < pFVar19->fractionality) break;
              pFVar22 = pFVar19 + -1;
            } while ((pFVar19->fractionality < dVar31) ||
                    (uVar20 = pFVar19->basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                    uVar20 = uVar20 >> 0x20,
                    ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                    (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20) <= uVar28
                    ));
          } while (begin._M_current < pFVar19);
          ppVar29 = (((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     local_c8._M_current)->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          ppVar29 = (pointer)0x0;
        }
        dVar4 = begin._M_current[-1].fractionality;
        dVar15 = begin._M_current[-1].row_ep_norm2;
        uVar7 = *(undefined8 *)((long)&begin._M_current[-1].score + 4);
        *(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4) =
             *(undefined8 *)((long)&begin._M_current[-1].row_ep_norm2 + 4);
        *(undefined8 *)((long)&(__first._M_current)->score + 4) = uVar7;
        (__first._M_current)->fractionality = dVar4;
        (__first._M_current)->row_ep_norm2 = dVar15;
        ppVar12 = begin._M_current[-1].row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             begin._M_current[-1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar12;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             begin._M_current[-1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        begin._M_current[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        begin._M_current[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        begin._M_current[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar29 == (pointer)0x0) {
          ppVar29 = (pointer)0x0;
        }
        else {
          local_60 = &begin._M_current[-1].row_ep;
          local_b8 = dVar31;
          local_48 = uVar32;
          uStack_44 = uVar33;
          uStack_40 = uVar34;
          uStack_3c = uVar35;
          operator_delete(ppVar29);
          ppVar29 = (local_60->
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          dVar31 = local_b8;
          uVar32 = local_48;
          uVar33 = uStack_44;
          uVar34 = uStack_40;
          uVar35 = uStack_3c;
        }
        begin._M_current[-1].fractionality = dVar31;
        begin._M_current[-1].row_ep_norm2 = local_98;
        begin._M_current[-1].score = (double)CONCAT44(uStack_8c,uStack_90);
        begin._M_current[-1].basisIndex = (HighsInt)local_b0;
        *(undefined4 *)
         &begin._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = uVar32;
        *(undefined4 *)
         ((long)&begin._M_current[-1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = uVar33;
        *(undefined4 *)
         &begin._M_current[-1].row_ep.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = uVar34;
        *(undefined4 *)
         ((long)&begin._M_current[-1].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar35;
        begin._M_current[-1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = local_50;
        if (ppVar29 != (pointer)0x0) {
          operator_delete(ppVar29);
        }
        _Var27._M_current = begin._M_current + -1;
        uVar20 = ((long)_Var27._M_current - (long)local_d0._M_current >> 3) * 0x6db6db6db6db6db7;
        local_b0 = (long)end._M_current - (long)begin._M_current;
        uVar28 = ((long)local_b0 >> 3) * 0x6db6db6db6db6db7;
        if (((long)uVar20 < (long)((ulong)local_f8 >> 3)) ||
           ((long)uVar28 < (long)((ulong)local_f8 >> 3))) {
          local_15c = local_15c + -1;
          if (local_15c == 0) {
            uVar28 = (ulong)((long)&local_f8[-1].row_ep.
                                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6) >> 1;
            pppVar24 = &__first._M_current[uVar28].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            do {
              local_138.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *pppVar24;
              local_138.fractionality = (double)pppVar24[-6];
              uVar7 = pppVar24[-5];
              uVar8 = *(undefined8 *)((long)pppVar24 + -0x24);
              local_138._20_8_ = *(undefined8 *)((long)pppVar24 + -0x1c);
              local_138.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   ((_Vector_impl_data *)(pppVar24 + -2))->_M_start;
              local_138.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pppVar24[-1];
              ((_Vector_impl_data *)(pppVar24 + -2))->_M_start = (pointer)0x0;
              pppVar24[-1] = (pointer)0x0;
              *pppVar24 = (pointer)0x0;
              local_138.score._0_4_ = (undefined4)((ulong)uVar8 >> 0x20);
              local_138.row_ep_norm2._0_4_ = (undefined4)uVar7;
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>>
                        (__first,uVar28,(long)local_f8,&local_138,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:124:11)>
                          )comp.this);
              if (local_138.row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_138.row_ep.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              pppVar24 = pppVar24 + -7;
              bVar17 = uVar28 != 0;
              uVar28 = uVar28 - 1;
            } while (bVar17);
            pppVar24 = &end._M_current[-1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            lVar23 = (long)end._M_current - (long)local_d0._M_current;
            do {
              local_138.fractionality = (double)pppVar24[-6];
              local_138._20_8_ = *(undefined8 *)((long)pppVar24 + -0x1c);
              uStack_88 = (undefined4)((ulong)*(undefined8 *)((long)pppVar24 + -0x24) >> 0x20);
              uStack_90 = SUB84(pppVar24[-5],0);
              uStack_8c = (undefined4)((ulong)pppVar24[-5] >> 0x20);
              local_138.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = *pppVar24;
              lVar23 = lVar23 + -0x38;
              local_138.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   ((_Vector_impl_data *)(pppVar24 + -2))->_M_start;
              local_138.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = pppVar24[-1];
              *pppVar24 = (pointer)0x0;
              ((_Vector_impl_data *)(pppVar24 + -2))->_M_start = (pointer)0x0;
              pppVar24[-1] = (pointer)0x0;
              dVar31 = (__first._M_current)->row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4);
              uVar8 = *(undefined8 *)((long)&(__first._M_current)->score + 4);
              pppVar24[-6] = (pointer)(__first._M_current)->fractionality;
              pppVar24[-5] = (pointer)dVar31;
              *(undefined8 *)((long)pppVar24 + -0x24) = uVar7;
              *(undefined8 *)((long)pppVar24 + -0x1c) = uVar8;
              ppVar29 = ((__first._M_current)->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              ((_Vector_impl_data *)(pppVar24 + -2))->_M_start =
                   ((__first._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              pppVar24[-1] = ppVar29;
              *pppVar24 = ((__first._M_current)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              *(pointer *)((long)local_c8._M_current + 0x10) = (pointer)0x0;
              (local_c8._M_current)->fractionality = 0;
              (local_c8._M_current)->row_ep_norm2 = 0.0;
              local_138.score._0_4_ = uStack_88;
              local_138.row_ep_norm2._0_4_ = uStack_90;
              local_138.row_ep_norm2._4_4_ = uStack_8c;
              local_98 = local_138.fractionality;
              uStack_84 = local_138._20_8_;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,long,FractionalInteger,__gnu_cxx::__ops::_Iter_comp_iter<HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>>
                        (__first,0,(lVar23 >> 3) * 0x6db6db6db6db6db7,&local_138,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsTableauSeparator_cpp:124:11)>
                          )comp.this);
              if (local_138.row_ep.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_138.row_ep.
                                super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
              pppVar24 = pppVar24 + -7;
            } while (0x38 < lVar23);
            return;
          }
          if (0x508 < (long)_Var27._M_current - (long)local_d0._M_current) {
            local_f8 = (FractionalInteger *)(uVar20 >> 2);
            dVar31 = (__first._M_current)->fractionality;
            dVar4 = (__first._M_current)->row_ep_norm2;
            uVar7 = *(undefined8 *)((long)&(__first._M_current)->score + 4);
            local_138.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
            ppVar29 = ((__first._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar12 = ((__first._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = ((__first._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            *(pointer *)((long)local_c8._M_current + 0x10) = (pointer)0x0;
            (local_c8._M_current)->fractionality = 0;
            (local_c8._M_current)->row_ep_norm2 = 0.0;
            dVar15 = __first._M_current[(long)local_f8].fractionality;
            dVar16 = __first._M_current[(long)local_f8].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&__first._M_current[(long)local_f8].row_ep_norm2 + 4);
            uVar8 = puVar1[1];
            *(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4) = *puVar1;
            *(undefined8 *)((long)&(__first._M_current)->score + 4) = uVar8;
            (__first._M_current)->fractionality = dVar15;
            (__first._M_current)->row_ep_norm2 = dVar16;
            ppVar14 = __first._M_current[(long)local_f8].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((__first._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 __first._M_current[(long)local_f8].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((__first._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            ((__first._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 __first._M_current[(long)local_f8].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&__first._M_current[(long)local_f8].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
            puVar1[1] = uVar7;
            __first._M_current[(long)local_f8].fractionality = dVar31;
            __first._M_current[(long)local_f8].row_ep_norm2 = dVar4;
            __first._M_current[(long)local_f8].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            __first._M_current[(long)local_f8].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            __first._M_current[(long)local_f8].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            local_138.fractionality = begin._M_current[-2].fractionality;
            dVar31 = begin._M_current[-2].row_ep_norm2;
            local_138._20_8_ = *(undefined8 *)((long)&begin._M_current[-2].score + 4);
            local_138.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&begin._M_current[-2].row_ep_norm2 + 4) >> 0x20);
            local_138.row_ep_norm2._0_4_ = SUB84(dVar31,0);
            local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar31 >> 0x20);
            ppVar29 = begin._M_current[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar12 = begin._M_current[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = begin._M_current[-2].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            begin._M_current[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            begin._M_current[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            begin._M_current[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar4 = _Var27._M_current[-(long)local_f8].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&begin._M_current[-1 - (long)local_f8].row_ep_norm2 + 4);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            begin._M_current[-2].fractionality = _Var27._M_current[-(long)local_f8].fractionality;
            begin._M_current[-2].row_ep_norm2 = dVar4;
            *(undefined8 *)((long)&begin._M_current[-2].row_ep_norm2 + 4) = uVar7;
            *(undefined8 *)((long)&begin._M_current[-2].score + 4) = uVar8;
            ppVar14 = begin._M_current[-1 - (long)local_f8].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            begin._M_current[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 begin._M_current[-1 - (long)local_f8].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            begin._M_current[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            begin._M_current[-2].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 begin._M_current[-1 - (long)local_f8].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&begin._M_current[-1 - (long)local_f8].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
            puVar1[1] = local_138._20_8_;
            _Var27._M_current[-(long)local_f8].fractionality = local_138.fractionality;
            _Var27._M_current[-(long)local_f8].row_ep_norm2 = dVar31;
            begin._M_current[-1 - (long)local_f8].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            begin._M_current[-1 - (long)local_f8].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            begin._M_current[-1 - (long)local_f8].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            if (0x80 < uVar20) {
              dVar31 = __first._M_current[1].fractionality;
              dVar4 = __first._M_current[1].row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&__first._M_current[1].score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&__first._M_current[1].row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
              ppVar29 = __first._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = __first._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = __first._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              __first._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              __first._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              __first._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar15 = __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep_norm2;
              puVar1 = (undefined8 *)
                       ((long)&__first._M_current[(long)((long)&local_f8->fractionality + 1)].
                               row_ep_norm2 + 4);
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              __first._M_current[1].fractionality =
                   __first._M_current[(long)((long)&local_f8->fractionality + 1)].fractionality;
              __first._M_current[1].row_ep_norm2 = dVar15;
              *(undefined8 *)((long)&__first._M_current[1].row_ep_norm2 + 4) = uVar8;
              *(undefined8 *)((long)&__first._M_current[1].score + 4) = uVar9;
              ppVar14 = __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              __first._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              __first._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              __first._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)
                       ((long)&__first._M_current[(long)((long)&local_f8->fractionality + 1)].
                               row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = uVar7;
              __first._M_current[(long)((long)&local_f8->fractionality + 1)].fractionality = dVar31;
              __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep_norm2 = dVar4;
              __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              __first._M_current[(long)((long)&local_f8->fractionality + 1)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              dVar31 = __first._M_current[2].fractionality;
              dVar4 = __first._M_current[2].row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&__first._M_current[2].score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&__first._M_current[2].row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
              ppVar29 = __first._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = __first._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = __first._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              __first._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              __first._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              __first._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar15 = __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep_norm2;
              puVar1 = (undefined8 *)
                       ((long)&__first._M_current[(long)((long)&local_f8->fractionality + 2)].
                               row_ep_norm2 + 4);
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              __first._M_current[2].fractionality =
                   __first._M_current[(long)((long)&local_f8->fractionality + 2)].fractionality;
              __first._M_current[2].row_ep_norm2 = dVar15;
              *(undefined8 *)((long)&__first._M_current[2].row_ep_norm2 + 4) = uVar8;
              *(undefined8 *)((long)&__first._M_current[2].score + 4) = uVar9;
              ppVar14 = __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              __first._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              __first._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              __first._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)
                       ((long)&__first._M_current[(long)((long)&local_f8->fractionality + 2)].
                               row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = uVar7;
              __first._M_current[(long)((long)&local_f8->fractionality + 2)].fractionality = dVar31;
              __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep_norm2 = dVar4;
              __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              __first._M_current[(long)((long)&local_f8->fractionality + 2)].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              uVar20 = ~(ulong)local_f8;
              dVar31 = begin._M_current[-3].fractionality;
              dVar4 = begin._M_current[-3].row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&begin._M_current[-3].score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&begin._M_current[-3].row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
              ppVar29 = begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = begin._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar15 = _Var27._M_current[uVar20].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&begin._M_current[uVar20 - 1].row_ep_norm2 + 4);
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              begin._M_current[-3].fractionality = _Var27._M_current[uVar20].fractionality;
              begin._M_current[-3].row_ep_norm2 = dVar15;
              *(undefined8 *)((long)&begin._M_current[-3].row_ep_norm2 + 4) = uVar8;
              *(undefined8 *)((long)&begin._M_current[-3].score + 4) = uVar9;
              ppVar14 = begin._M_current[uVar20 - 1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   begin._M_current[uVar20 - 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              begin._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   begin._M_current[uVar20 - 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&begin._M_current[uVar20 - 1].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = uVar7;
              _Var27._M_current[uVar20].fractionality = dVar31;
              _Var27._M_current[uVar20].row_ep_norm2 = dVar4;
              begin._M_current[uVar20 - 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              begin._M_current[uVar20 - 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              begin._M_current[uVar20 - 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              lVar23 = -(long)local_f8;
              local_138.fractionality = begin._M_current[-4].fractionality;
              dVar31 = begin._M_current[-4].row_ep_norm2;
              local_138._20_8_ = *(undefined8 *)((long)&begin._M_current[-4].score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&begin._M_current[-4].row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._0_4_ = SUB84(dVar31,0);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar31 >> 0x20);
              ppVar29 = begin._M_current[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = begin._M_current[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = begin._M_current[-4].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              begin._M_current[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              begin._M_current[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar4 = _Var27._M_current[lVar23 + -2].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&begin._M_current[lVar23 + -3].row_ep_norm2 + 4);
              uVar7 = *puVar1;
              uVar8 = puVar1[1];
              begin._M_current[-4].fractionality = _Var27._M_current[lVar23 + -2].fractionality;
              begin._M_current[-4].row_ep_norm2 = dVar4;
              *(undefined8 *)((long)&begin._M_current[-4].row_ep_norm2 + 4) = uVar7;
              *(undefined8 *)((long)&begin._M_current[-4].score + 4) = uVar8;
              ppVar14 = begin._M_current[lVar23 + -3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   begin._M_current[lVar23 + -3].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              begin._M_current[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              begin._M_current[-4].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   begin._M_current[lVar23 + -3].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&begin._M_current[lVar23 + -3].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = local_138._20_8_;
              _Var27._M_current[lVar23 + -2].fractionality = local_138.fractionality;
              _Var27._M_current[lVar23 + -2].row_ep_norm2 = dVar31;
              begin._M_current[lVar23 + -3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              begin._M_current[lVar23 + -3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              begin._M_current[lVar23 + -3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            }
          }
          if (0x508 < (long)local_b0) {
            uVar20 = uVar28 >> 2;
            dVar31 = (begin._M_current)->fractionality;
            dVar4 = (begin._M_current)->row_ep_norm2;
            uVar7 = *(undefined8 *)((long)&(begin._M_current)->score + 4);
            local_138.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
            ppVar29 = ((begin._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar12 = ((begin._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = ((begin._M_current)->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar15 = begin._M_current[uVar20].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&begin._M_current[uVar20].row_ep_norm2 + 4);
            uVar8 = *puVar1;
            uVar9 = puVar1[1];
            (begin._M_current)->fractionality = begin._M_current[uVar20].fractionality;
            (begin._M_current)->row_ep_norm2 = dVar15;
            *(undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + 4) = uVar8;
            *(undefined8 *)((long)&(begin._M_current)->score + 4) = uVar9;
            ppVar14 = begin._M_current[uVar20].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 begin._M_current[uVar20].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            ((begin._M_current)->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 begin._M_current[uVar20].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&begin._M_current[uVar20].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
            puVar1[1] = uVar7;
            begin._M_current[uVar20].fractionality = dVar31;
            begin._M_current[uVar20].row_ep_norm2 = dVar4;
            begin._M_current[uVar20].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            begin._M_current[uVar20].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            begin._M_current[uVar20].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            local_138.fractionality = (local_e0._M_current)->fractionality;
            dVar31 = (local_e0._M_current)->row_ep_norm2;
            local_138._20_8_ = *(undefined8 *)((long)&(local_e0._M_current)->score + 4);
            local_138.score._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)((long)&(local_e0._M_current)->row_ep_norm2 + 4) >> 0x20);
            local_138.row_ep_norm2._0_4_ = SUB84(dVar31,0);
            local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar31 >> 0x20);
            ppVar29 = end._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar12 = end._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = end._M_current[-1].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (local_68->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (local_68->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_68->
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            dVar4 = end._M_current[-uVar20].fractionality;
            dVar15 = end._M_current[-uVar20].row_ep_norm2;
            puVar1 = (undefined8 *)((long)&end._M_current[-uVar20].row_ep_norm2 + 4);
            uVar7 = puVar1[1];
            *(undefined8 *)((long)&(local_e0._M_current)->row_ep_norm2 + 4) = *puVar1;
            *(undefined8 *)((long)&(local_e0._M_current)->score + 4) = uVar7;
            (local_e0._M_current)->fractionality = dVar4;
            (local_e0._M_current)->row_ep_norm2 = dVar15;
            ppVar14 = end._M_current[-uVar20].row_ep.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            end._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 end._M_current[-uVar20].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            end._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            end._M_current[-1].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 end._M_current[-uVar20].row_ep.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar1 = (undefined8 *)((long)&end._M_current[-uVar20].row_ep_norm2 + 4);
            *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
            puVar1[1] = local_138._20_8_;
            end._M_current[-uVar20].fractionality = local_138.fractionality;
            end._M_current[-uVar20].row_ep_norm2 = dVar31;
            end._M_current[-uVar20].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            end._M_current[-uVar20].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            end._M_current[-uVar20].row_ep.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            local_f8 = _Var27._M_current;
            if (0x80 < uVar28) {
              dVar31 = begin._M_current[1].fractionality;
              dVar4 = begin._M_current[1].row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&begin._M_current[1].score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&begin._M_current[1].row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
              ppVar29 = begin._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = begin._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = begin._M_current[1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar15 = begin._M_current[uVar20 + 1].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&begin._M_current[uVar20 + 1].row_ep_norm2 + 4);
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              begin._M_current[1].fractionality = begin._M_current[uVar20 + 1].fractionality;
              begin._M_current[1].row_ep_norm2 = dVar15;
              *(undefined8 *)((long)&begin._M_current[1].row_ep_norm2 + 4) = uVar8;
              *(undefined8 *)((long)&begin._M_current[1].score + 4) = uVar9;
              ppVar14 = begin._M_current[uVar20 + 1].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   begin._M_current[uVar20 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              begin._M_current[1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   begin._M_current[uVar20 + 1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&begin._M_current[uVar20 + 1].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = uVar7;
              begin._M_current[uVar20 + 1].fractionality = dVar31;
              begin._M_current[uVar20 + 1].row_ep_norm2 = dVar4;
              begin._M_current[uVar20 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              begin._M_current[uVar20 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              begin._M_current[uVar20 + 1].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              dVar31 = begin._M_current[2].fractionality;
              dVar4 = begin._M_current[2].row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&begin._M_current[2].score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&begin._M_current[2].row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
              ppVar29 = begin._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = begin._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = begin._M_current[2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar15 = begin._M_current[uVar20 + 2].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&begin._M_current[uVar20 + 2].row_ep_norm2 + 4);
              uVar8 = *puVar1;
              uVar9 = puVar1[1];
              begin._M_current[2].fractionality = begin._M_current[uVar20 + 2].fractionality;
              begin._M_current[2].row_ep_norm2 = dVar15;
              *(undefined8 *)((long)&begin._M_current[2].row_ep_norm2 + 4) = uVar8;
              *(undefined8 *)((long)&begin._M_current[2].score + 4) = uVar9;
              ppVar14 = begin._M_current[uVar20 + 2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   begin._M_current[uVar20 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              begin._M_current[2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   begin._M_current[uVar20 + 2].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&begin._M_current[uVar20 + 2].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = uVar7;
              begin._M_current[uVar20 + 2].fractionality = dVar31;
              begin._M_current[uVar20 + 2].row_ep_norm2 = dVar4;
              begin._M_current[uVar20 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              begin._M_current[uVar20 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              begin._M_current[uVar20 + 2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              uVar28 = ~uVar20;
              dVar31 = (local_a0._M_current)->fractionality;
              dVar4 = (local_a0._M_current)->row_ep_norm2;
              uVar7 = *(undefined8 *)((long)&(local_a0._M_current)->score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&(local_a0._M_current)->row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
              ppVar29 = end._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = end._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = end._M_current[-2].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              (local_70->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_70->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_70->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar15 = end._M_current[uVar28].fractionality;
              dVar16 = end._M_current[uVar28].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&end._M_current[uVar28].row_ep_norm2 + 4);
              uVar8 = puVar1[1];
              *(undefined8 *)((long)&(local_a0._M_current)->row_ep_norm2 + 4) = *puVar1;
              *(undefined8 *)((long)&(local_a0._M_current)->score + 4) = uVar8;
              (local_a0._M_current)->fractionality = dVar15;
              (local_a0._M_current)->row_ep_norm2 = dVar16;
              ppVar14 = end._M_current[uVar28].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              end._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   end._M_current[uVar28].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              end._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              end._M_current[-2].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   end._M_current[uVar28].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&end._M_current[uVar28].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = uVar7;
              end._M_current[uVar28].fractionality = dVar31;
              end._M_current[uVar28].row_ep_norm2 = dVar4;
              end._M_current[uVar28].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              end._M_current[uVar28].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              end._M_current[uVar28].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
              lVar23 = -2 - uVar20;
              local_138.fractionality = (local_a8._M_current)->fractionality;
              dVar31 = (local_a8._M_current)->row_ep_norm2;
              local_138._20_8_ = *(undefined8 *)((long)&(local_a8._M_current)->score + 4);
              local_138.score._0_4_ =
                   (undefined4)
                   ((ulong)*(undefined8 *)((long)&(local_a8._M_current)->row_ep_norm2 + 4) >> 0x20);
              local_138.row_ep_norm2._0_4_ = SUB84(dVar31,0);
              local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar31 >> 0x20);
              ppVar29 = end._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              ppVar12 = end._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar13 = end._M_current[-3].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              (local_78->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_78->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_78->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              dVar4 = end._M_current[lVar23].fractionality;
              dVar15 = end._M_current[lVar23].row_ep_norm2;
              puVar1 = (undefined8 *)((long)&end._M_current[lVar23].row_ep_norm2 + 4);
              uVar7 = puVar1[1];
              *(undefined8 *)((long)&(local_a8._M_current)->row_ep_norm2 + 4) = *puVar1;
              *(undefined8 *)((long)&(local_a8._M_current)->score + 4) = uVar7;
              (local_a8._M_current)->fractionality = dVar4;
              (local_a8._M_current)->row_ep_norm2 = dVar15;
              ppVar14 = end._M_current[lVar23].row_ep.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              end._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   end._M_current[lVar23].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              end._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar14;
              end._M_current[-3].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   end._M_current[lVar23].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              puVar1 = (undefined8 *)((long)&end._M_current[lVar23].row_ep_norm2 + 4);
              *puVar1 = CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
              puVar1[1] = local_138._20_8_;
              end._M_current[lVar23].fractionality = local_138.fractionality;
              end._M_current[lVar23].row_ep_norm2 = dVar31;
              end._M_current[lVar23].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start = ppVar12;
              end._M_current[lVar23].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = ppVar13;
              end._M_current[lVar23].row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            }
          }
        }
        else if (((pFVar18 <= local_58) &&
                 (local_f8 = _Var27._M_current,
                 bVar17 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                                    (__first,_Var27,comp), _Var27._M_current = local_f8, bVar17)) &&
                (bVar17 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
                                    (begin,end,comp), _Var27._M_current = local_f8, bVar17)) {
          return;
        }
        pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1,false>
                  (__first,_Var27,comp,local_15c,(bool)((byte)local_d8 & 1));
        local_d8 = (FractionalInteger *)((ulong)local_d8 & 0xffffffff00000000);
        uVar28 = local_b0;
      }
      else {
        local_98 = (__first._M_current)->row_ep_norm2;
        uStack_90 = SUB84((__first._M_current)->score,0);
        uStack_8c = (undefined4)((ulong)(__first._M_current)->score >> 0x20);
        iVar5 = (__first._M_current)->basisIndex;
        uVar32 = *(undefined4 *)
                  &((__first._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar33 = *(undefined4 *)
                  ((long)&((__first._M_current)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
        uVar34 = *(undefined4 *)
                  &((__first._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar35 = *(undefined4 *)
                  ((long)&((__first._M_current)->row_ep).
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4);
        local_c8._M_current =
             (FractionalInteger *)
             ((__first._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar23 = (comp.this)->numTries;
        local_f8 = (FractionalInteger *)CONCAT44(local_f8._4_4_,iVar5);
        uVar28 = lVar23 + iVar5;
        uVar20 = uVar28 & 0xffffffff;
        uVar28 = uVar28 >> 0x20;
        uVar28 = (uVar28 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20 ^
                 (uVar28 + 0x8a183895eeac1536) * (uVar20 + 0x42d8680e260ae5b);
        lVar26 = 0;
        while ((dVar4 = *(double *)((long)&(local_e0._M_current)->fractionality + lVar26),
               dVar4 < dVar31 ||
               ((dVar4 <= dVar31 &&
                (uVar20 = *(int *)((long)&(local_e0._M_current)->basisIndex + lVar26) + lVar23,
                uVar25 = uVar20 & 0xffffffff, uVar20 = uVar20 >> 0x20,
                ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20) < uVar28)))))
        {
          lVar26 = lVar26 + -0x38;
        }
        pFVar18 = (FractionalInteger *)((long)&(local_e0._M_current)->fractionality + lVar26);
        if (lVar26 == 0) {
          pFVar19 = __first._M_current + 1;
          do {
            pFVar30 = pFVar19;
            pFVar22 = pFVar30 + -1;
            if ((pFVar18 <= pFVar30 + -1) || (pFVar22 = pFVar30, pFVar30->fractionality < dVar31))
            break;
            pFVar19 = pFVar30 + 1;
          } while ((dVar31 < pFVar30->fractionality) ||
                  (uVar20 = pFVar30->basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                  uVar20 = uVar20 >> 0x20,
                  uVar28 <= ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                            (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20)))
          ;
        }
        else {
          pFVar19 = __first._M_current + 1;
          do {
            pFVar22 = pFVar19;
            if (pFVar22->fractionality < dVar31) break;
            pFVar19 = pFVar22 + 1;
          } while ((dVar31 < pFVar22->fractionality) ||
                  (uVar20 = pFVar22->basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                  uVar20 = uVar20 >> 0x20,
                  uVar28 <= ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                            (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20)))
          ;
        }
        if (pFVar22 < pFVar18) {
          do {
            local_138.fractionality = pFVar22->fractionality;
            dVar4 = pFVar22->row_ep_norm2;
            local_138._20_8_ = *(undefined8 *)((long)&pFVar22->score + 4);
            local_138.score._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&pFVar22->row_ep_norm2 + 4) >> 0x20);
            local_138.row_ep_norm2._0_4_ = SUB84(dVar4,0);
            local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)dVar4 >> 0x20);
            ppVar29 = (pFVar22->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            ppVar12 = (pFVar22->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar13 = (pFVar22->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar22->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pFVar22->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pFVar22->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            dVar15 = pFVar18->row_ep_norm2;
            uVar7 = *(undefined8 *)((long)&pFVar18->row_ep_norm2 + 4);
            uVar8 = *(undefined8 *)((long)&pFVar18->score + 4);
            pFVar22->fractionality = pFVar18->fractionality;
            pFVar22->row_ep_norm2 = dVar15;
            *(undefined8 *)((long)&pFVar22->row_ep_norm2 + 4) = uVar7;
            *(undefined8 *)((long)&pFVar22->score + 4) = uVar8;
            ppVar14 = (pFVar18->row_ep).
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            (pFVar22->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pFVar18->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (pFVar22->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar14;
            (pFVar22->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pFVar18->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            *(ulong *)((long)&pFVar18->row_ep_norm2 + 4) =
                 CONCAT44(local_138.score._0_4_,local_138.row_ep_norm2._4_4_);
            *(undefined8 *)((long)&pFVar18->score + 4) = local_138._20_8_;
            pFVar18->fractionality = local_138.fractionality;
            pFVar18->row_ep_norm2 = dVar4;
            (pFVar18->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start = ppVar12;
            (pFVar18->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish = ppVar13;
            (pFVar18->row_ep).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
            lVar23 = (comp.this)->numTries;
            uVar28 = lVar23 + iVar5;
            uVar20 = uVar28 & 0xffffffff;
            uVar28 = uVar28 >> 0x20;
            uVar28 = (uVar28 + 0x80c8963be3e4c2f3) * (uVar20 + 0xc8497d2a400d9551) >> 0x20 ^
                     (uVar28 + 0x8a183895eeac1536) * (uVar20 + 0x42d8680e260ae5b);
            do {
              do {
                pFVar19 = pFVar18;
                pFVar18 = pFVar19 + -1;
              } while (pFVar18->fractionality < dVar31);
            } while ((pFVar18->fractionality <= dVar31) &&
                    (uVar20 = pFVar19[-1].basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                    uVar20 = uVar20 >> 0x20,
                    ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                    (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20) < uVar28)
                    );
            pFVar19 = pFVar22 + 1;
            do {
              pFVar22 = pFVar19;
              if (pFVar22->fractionality < dVar31) break;
              pFVar19 = pFVar22 + 1;
            } while ((dVar31 < pFVar22->fractionality) ||
                    (uVar20 = pFVar22->basisIndex + lVar23, uVar25 = uVar20 & 0xffffffff,
                    uVar20 = uVar20 >> 0x20,
                    uVar28 <= ((uVar25 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
                              (uVar20 + 0x80c8963be3e4c2f3) * (uVar25 + 0xc8497d2a400d9551) >> 0x20)
                    ));
          } while (pFVar22 < pFVar18);
          ppVar29 = ((__first._M_current)->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          ppVar29 = (pointer)0x0;
        }
        dVar4 = pFVar18->fractionality;
        dVar15 = pFVar18->row_ep_norm2;
        uVar7 = *(undefined8 *)((long)&pFVar18->score + 4);
        *(undefined8 *)((long)&(__first._M_current)->row_ep_norm2 + 4) =
             *(undefined8 *)((long)&pFVar18->row_ep_norm2 + 4);
        *(undefined8 *)((long)&(__first._M_current)->score + 4) = uVar7;
        (__first._M_current)->fractionality = dVar4;
        (__first._M_current)->row_ep_norm2 = dVar15;
        ppVar12 = (pFVar18->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pFVar18->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar12;
        ((__first._M_current)->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pFVar18->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pFVar18->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar18->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar18->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (ppVar29 == (pointer)0x0) {
          ppVar29 = (pointer)0x0;
        }
        else {
          local_b8 = dVar31;
          operator_delete(ppVar29);
          ppVar29 = (pFVar18->row_ep).
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar31 = local_b8;
        }
        pFVar18->fractionality = dVar31;
        pFVar18->row_ep_norm2 = local_98;
        pFVar18->score = (double)CONCAT44(uStack_8c,uStack_90);
        pFVar18->basisIndex = (HighsInt)local_f8;
        *(undefined4 *)
         &(pFVar18->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = uVar32;
        *(undefined4 *)
         ((long)&(pFVar18->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = uVar33;
        *(undefined4 *)
         &(pFVar18->row_ep).
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = uVar34;
        *(undefined4 *)
         ((long)&(pFVar18->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = uVar35;
        (pFVar18->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._M_current;
        if (ppVar29 != (pointer)0x0) {
          operator_delete(ppVar29);
        }
        begin._M_current = pFVar18 + 1;
        uVar28 = (long)end._M_current - (long)begin._M_current;
      }
      local_d0._M_current = begin._M_current;
    } while (0x53f < (long)uVar28);
    if (((ulong)local_d8 & 1) == 0) goto LAB_002eb363;
  }
  if ((begin._M_current != end._M_current) &&
     (pFVar18 = begin._M_current + 1, pFVar18 != end._M_current)) {
    local_e0._M_current = (FractionalInteger *)0x0;
    local_d8 = begin._M_current;
    do {
      dVar31 = local_d8[1].fractionality;
      iVar5 = local_d8[1].basisIndex;
      local_f8 = (FractionalInteger *)CONCAT44(local_f8._4_4_,iVar5);
      if ((local_d8->fractionality < dVar31) ||
         ((local_d8->fractionality <= dVar31 &&
          (uVar25 = (long)local_d8->basisIndex + (comp.this)->numTries, uVar28 = uVar25 & 0xffffffff
          , uVar25 = uVar25 >> 0x20, uVar20 = (comp.this)->numTries + (long)iVar5,
          uVar21 = uVar20 & 0xffffffff, uVar20 = uVar20 >> 0x20,
          ((uVar28 + 0x42d8680e260ae5b) * (uVar25 + 0x8a183895eeac1536) ^
          (uVar25 + 0x80c8963be3e4c2f3) * (uVar28 + 0xc8497d2a400d9551) >> 0x20) <
          ((uVar21 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
          (uVar20 + 0x80c8963be3e4c2f3) * (uVar21 + 0xc8497d2a400d9551) >> 0x20))))) {
        local_138.fractionality = local_d8[1].row_ep_norm2;
        local_138.row_ep_norm2._0_4_ = SUB84(local_d8[1].score,0);
        local_138.row_ep_norm2._4_4_ = (undefined4)((ulong)local_d8[1].score >> 0x20);
        local_c8._M_current =
             (FractionalInteger *)
             local_d8[1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
        ppStack_c0 = local_d8[1].row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        local_d0._M_current =
             (FractionalInteger *)
             local_d8[1].row_ep.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_d8[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8[1].row_ep.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar23 = (long)local_e0._M_current;
        local_d8 = pFVar18;
        while( true ) {
          puVar1 = (undefined8 *)((long)&(begin._M_current)->fractionality + lVar23);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(begin._M_current)->row_ep_norm2 + lVar23 + 4);
          uVar9 = puVar1[1];
          puVar2 = (undefined8 *)
                   ((long)&((begin._M_current)->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar23);
          uVar10 = *puVar2;
          uVar11 = puVar2[1];
          puVar2 = (undefined8 *)((long)&begin._M_current[1].row_ep_norm2 + lVar23 + 4);
          *puVar2 = *puVar1;
          puVar2[1] = uVar9;
          puVar1 = (undefined8 *)((long)&begin._M_current[1].fractionality + lVar23);
          *puVar1 = uVar7;
          puVar1[1] = uVar8;
          pvVar6 = *(void **)((long)&begin._M_current[1].row_ep.
                                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar23);
          puVar1 = (undefined8 *)
                   ((long)&begin._M_current[1].row_ep.
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar23);
          *puVar1 = uVar10;
          puVar1[1] = uVar11;
          *(undefined8 *)
           ((long)&begin._M_current[1].row_ep.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23) =
               *(undefined8 *)
                ((long)&((begin._M_current)->row_ep).
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23);
          puVar1 = (undefined8 *)
                   ((long)&((begin._M_current)->row_ep).
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar23);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)
           ((long)&((begin._M_current)->row_ep).
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23) = 0;
          if (pvVar6 != (void *)0x0) {
            operator_delete(pvVar6);
          }
          pFVar18 = begin._M_current;
          if (lVar23 == 0) goto LAB_002ea149;
          dVar4 = *(double *)((long)&begin._M_current[-1].fractionality + lVar23);
          if ((dVar31 <= dVar4) &&
             ((dVar31 < dVar4 ||
              (uVar25 = (long)*(int *)((long)begin._M_current + lVar23 + -0x20) +
                        (comp.this)->numTries, uVar28 = uVar25 & 0xffffffff, uVar25 = uVar25 >> 0x20
              , uVar20 = (comp.this)->numTries + (long)iVar5, uVar21 = uVar20 & 0xffffffff,
              uVar20 = uVar20 >> 0x20,
              ((uVar21 + 0x42d8680e260ae5b) * (uVar20 + 0x8a183895eeac1536) ^
              (uVar20 + 0x80c8963be3e4c2f3) * (uVar21 + 0xc8497d2a400d9551) >> 0x20) <=
              ((uVar28 + 0x42d8680e260ae5b) * (uVar25 + 0x8a183895eeac1536) ^
              (uVar25 + 0x80c8963be3e4c2f3) * (uVar28 + 0xc8497d2a400d9551) >> 0x20))))) break;
          lVar23 = lVar23 + -0x38;
        }
        pFVar18 = (FractionalInteger *)((long)&(begin._M_current)->fractionality + lVar23);
LAB_002ea149:
        pFVar18->fractionality = dVar31;
        pdVar3 = (double *)((long)&(begin._M_current)->row_ep_norm2 + lVar23);
        *pdVar3 = local_138.fractionality;
        pdVar3[1] = (double)CONCAT44(local_138.row_ep_norm2._4_4_,local_138.row_ep_norm2._0_4_);
        *(HighsInt *)((long)&(begin._M_current)->basisIndex + lVar23) = (HighsInt)local_f8;
        pvVar6 = *(void **)((long)&((begin._M_current)->row_ep).
                                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar23);
        puVar1 = (undefined8 *)
                 ((long)&((begin._M_current)->row_ep).
                         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar23);
        *puVar1 = local_c8._M_current;
        puVar1[1] = ppStack_c0;
        *(FractionalInteger **)
         ((long)&((begin._M_current)->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar23) = local_d0._M_current;
        pFVar18 = local_d8;
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6);
          pFVar18 = local_d8;
        }
      }
      local_d8 = pFVar18;
      pFVar18 = local_d8 + 1;
      local_e0._M_current = local_e0._M_current + 0x38;
    } while (pFVar18 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }